

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O0

uint16_t byteutil_read_uint16(uint8_t **buffer,size_t byteLen)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  uint16_t result;
  size_t byteLen_local;
  uint8_t **buffer_local;
  
  l._6_2_ = 0;
  if (((buffer == (uint8_t **)0x0) || (*buffer == (uint8_t *)0x0)) || (byteLen < 2)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                ,"byteutil_read_uint16",0x9d,1,"byteutil_read_uint16 == NULL or less than 2");
    }
  }
  else {
    l._6_2_ = (ushort)**buffer * 0x100 + (ushort)(*buffer)[1];
    *buffer = *buffer + 2;
  }
  return l._6_2_;
}

Assistant:

static uint16_t byteutil_read_uint16(uint8_t** buffer, size_t byteLen)
{
    uint16_t result = 0;
    if (buffer != NULL && *buffer != NULL && byteLen >= 2)
    {
        result = 256 * (**buffer) + (*(*buffer + 1));
        *buffer += 2; // Move the ptr
    }
    else
    {
        LogError("byteutil_read_uint16 == NULL or less than 2");
    }
    return result;
}